

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O3

int Abc_DesFindTopLevelModels(Abc_Des_t *p)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  pVVar7 = p->vModules;
  lVar8 = (long)pVVar7->nSize;
  if (0 < lVar8) {
    ppvVar6 = pVVar7->pArray;
    lVar9 = 0;
    do {
      *(undefined4 *)((long)ppvVar6[lVar9] + 0xc0) = 0;
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
    lVar9 = 0;
    do {
      lVar2 = *(long *)((long)ppvVar6[lVar9] + 0x50);
      lVar10 = (long)*(int *)(lVar2 + 4);
      if (0 < lVar10) {
        lVar2 = *(long *)(lVar2 + 8);
        lVar11 = 0;
        do {
          lVar3 = *(long *)(lVar2 + lVar11 * 8);
          if (((*(uint *)(lVar3 + 0x14) & 0xf) != 8) &&
             (lVar3 = *(long *)(lVar3 + 0x38), lVar3 != 0)) {
            *(undefined4 *)(lVar3 + 0xc0) = 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar8);
    p->vTops->nSize = 0;
    if (pVVar7->nSize < 1) {
      iVar5 = 0;
    }
    else {
      lVar8 = 0;
      do {
        pvVar4 = pVVar7->pArray[lVar8];
        if (*(int *)((long)pvVar4 + 0xc0) == 0) {
          pVVar7 = p->vTops;
          uVar1 = pVVar7->nSize;
          if (uVar1 == pVVar7->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar6;
              pVVar7->nCap = 0x10;
            }
            else {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
              }
              pVVar7->pArray = ppvVar6;
              pVVar7->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar6 = pVVar7->pArray;
          }
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          ppvVar6[iVar5] = pvVar4;
          pVVar7 = p->vModules;
        }
        else {
          *(undefined4 *)((long)pvVar4 + 0xc0) = 0;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar7->nSize);
      iVar5 = p->vTops->nSize;
    }
    return iVar5;
  }
  __assert_fail("Vec_PtrSize( p->vModules ) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLib.c"
                ,0x12a,"int Abc_DesFindTopLevelModels(Abc_Des_t *)");
}

Assistant:

int Abc_DesFindTopLevelModels( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Vec_PtrSize( p->vModules ) > 0 );
    // clear the models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    // mark all the models reachable from other models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        Abc_NtkForEachBox( pNtk, pObj, k )
        {
            if ( Abc_ObjIsLatch(pObj) )
                continue;
            if ( pObj->pData == NULL )
                continue;
            pNtkBox = (Abc_Ntk_t *)pObj->pData;
            pNtkBox->fHieVisited = 1;
        }
    }
    // collect the models that are not marked
    Vec_PtrClear( p->vTops );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        if ( pNtk->fHieVisited == 0 )
            Vec_PtrPush( p->vTops, pNtk );
        else
            pNtk->fHieVisited = 0;
    }
    return Vec_PtrSize( p->vTops );
}